

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O0

Type * __thiscall
slang::ast::GenericClassDefSymbol::getSpecializationImpl
          (GenericClassDefSymbol *this,ASTContext *context,SourceLocation instanceLoc,
          bool forceInvalidParams,ParameterValueAssignmentSyntax *syntax)

{
  span<const_slang::ast::DefinitionSymbol::ParameterDecl,_18446744073709551615UL> parameterDecls;
  string_view definitionName;
  DiagCode code;
  string_view arg;
  span<const_slang::ast::Type_*const,_18446744073709551615UL> typeParams_00;
  span<const_slang::ConstantValue_*const,_18446744073709551615UL> paramValues_00;
  byte bVar1;
  bool bVar2;
  int iVar3;
  CompilationOptions *pCVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>
  *paVar5;
  type_conflict2 *ptVar6;
  pointer ppVar7;
  ClassSpecializationKey *pCVar8;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
  *ptVar9;
  ClassType **args_2;
  SyntaxNode *this_00;
  byte in_CL;
  uint uVar10;
  SourceLocation in_RDX;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  ClassType *in_RSI;
  GenericClassDefSymbol *in_RDI;
  ClassDeclarationSyntax *in_R8;
  type_conflict2 *inserted_1;
  type *it_1;
  type_conflict2 *inserted;
  type *it;
  ClassSpecializationKey key;
  TypeParameterSymbol *tps;
  ParameterSymbol *ps;
  Symbol *sym;
  ParameterSymbolBase *param;
  ParameterDecl *decl;
  const_iterator __end2;
  const_iterator __begin2;
  SmallVector<slang::ast::DefinitionSymbol::ParameterDecl,_8UL> *__range2;
  SmallVector<const_slang::ast::Type_*,_5UL> typeParams;
  SmallVector<const_slang::ConstantValue_*,_5UL> paramValues;
  SourceRange instRange;
  ParameterBuilder paramBuilder;
  bool isForDefault;
  ClassType *classType;
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_ast_symbols_ClassSymbols_cpp:946:29)>
  guard;
  Scope *scope;
  Compilation *comp;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>,_slang::ast::detail::ClassSpecializationKey_&,_void>
  x;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>,_slang::ast::detail::ClassSpecializationKey_&,_void>
  x_1;
  locator loc_1;
  size_t pos0_1;
  size_t hash_1;
  ClassSpecializationKey *k_1;
  locator loc;
  size_t pos0;
  size_t hash;
  ClassSpecializationKey *k;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  uint n_1;
  value_type *p_1;
  value_type *elements_1;
  int mask_1;
  group_type *pg_1;
  size_t pos_1;
  prober pb_1;
  ClassType *in_stack_fffffffffffff768;
  ClassType *pCVar11;
  Compilation *in_stack_fffffffffffff770;
  SmallVector<slang::ast::DefinitionSymbol::ParameterDecl,_8UL> *in_stack_fffffffffffff778;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff780;
  SourceLocation in_stack_fffffffffffff788;
  undefined4 in_stack_fffffffffffff790;
  undefined1 in_stack_fffffffffffff794;
  undefined1 in_stack_fffffffffffff795;
  undefined1 in_stack_fffffffffffff796;
  undefined1 in_stack_fffffffffffff797;
  Compilation *in_stack_fffffffffffff798;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
  *in_stack_fffffffffffff7a0;
  Scope *in_stack_fffffffffffff7a8;
  undefined4 in_stack_fffffffffffff7b0;
  undefined4 in_stack_fffffffffffff7b4;
  size_t in_stack_fffffffffffff7b8;
  SpecMap *pSVar12;
  char *in_stack_fffffffffffff7c0;
  ClassSpecializationKey *in_stack_fffffffffffff7d0;
  pointer in_stack_fffffffffffff7d8;
  SpecMap *pSVar13;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff7e0;
  undefined6 in_stack_fffffffffffff7e8;
  undefined1 in_stack_fffffffffffff7ee;
  undefined1 in_stack_fffffffffffff7ef;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff7f0;
  ClassSpecializationKey *in_stack_fffffffffffff7f8;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
  *in_stack_fffffffffffff800;
  bool local_729;
  ParameterSymbol *in_stack_fffffffffffff918;
  table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
  in_stack_fffffffffffff920;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_6b8;
  undefined8 local_6a0;
  undefined8 local_680;
  ClassSpecializationKey local_660;
  Type *local_638;
  TypeParameterSymbol *local_630;
  ConstantValue *local_610;
  ParameterSymbol *local_608;
  Symbol *local_600;
  ParameterSymbolBase *local_5f0;
  const_iterator local_5e8;
  const_iterator local_5e0;
  const_iterator local_5d8;
  SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl> *local_5d0;
  SmallVectorBase<const_slang::ast::Type_*> local_5c8 [2];
  SmallVectorBase<const_slang::ConstantValue_*> local_588 [2];
  SourceLocation local_548;
  SourceLocation in_stack_fffffffffffffac8;
  SourceLocation in_stack_fffffffffffffad0;
  SourceLocation in_stack_fffffffffffffad8;
  ParameterBuilder local_508;
  byte local_369;
  ClassType *local_368;
  undefined4 local_35c;
  char *local_358;
  SourceLocation SStack_350;
  SymbolIndex local_338;
  anon_class_8_1_8991fb9c_for_func local_328;
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_ast_symbols_ClassSymbols_cpp:946:29)>
  local_320;
  Scope *local_310;
  Compilation *local_308;
  undefined7 in_stack_fffffffffffffd08;
  ClassType *local_2d8;
  undefined1 local_299;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>,_slang::ast::detail::ClassSpecializationKey_&,_void>
  local_298;
  ClassType *local_290;
  _Storage<unsigned_long,_true> local_288;
  SpecMap *local_280;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>,_slang::ast::detail::ClassSpecializationKey_&,_void>
  local_270;
  ClassType *local_268;
  ClassSpecializationKey *local_260;
  SpecMap *local_258;
  bool local_249 [25];
  iterator local_230;
  bool local_219 [25];
  iterator local_200;
  bool local_1e9;
  iterator local_1e8;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>
  local_1d8;
  size_t local_1c0;
  undefined8 in_stack_fffffffffffffe48;
  undefined1 isFromConfig;
  ClassType **ppCVar14;
  ParameterValueAssignmentSyntax *in_stack_fffffffffffffe50;
  ParameterBuilder *in_stack_fffffffffffffe58;
  bool local_181 [25];
  iterator local_168;
  bool local_151 [25];
  iterator local_138;
  bool local_121;
  iterator local_120;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>
  local_110;
  size_t local_f8;
  size_t local_f0;
  ClassSpecializationKey *local_e8;
  ClassType *local_e0;
  ClassSpecializationKey *local_d8;
  undefined1 *local_d0;
  SpecMap *local_c8;
  uint local_bc;
  value_type *local_b8;
  value_type *local_b0;
  uint local_a4;
  group_type *local_a0;
  size_t local_98;
  pow2_quadratic_prober local_90;
  size_t local_80;
  size_t local_78;
  ClassSpecializationKey *local_70;
  SpecMap *local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  ClassType **local_20;
  size_t local_18;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
  *local_10;
  SpecMap *local_8;
  
  isFromConfig = (undefined1)((ulong)in_stack_fffffffffffffe48 >> 0x38);
  bVar1 = in_CL & 1;
  local_308 = ASTContext::getCompilation((ASTContext *)0x3fb16f);
  local_310 = Symbol::getParentScope(&in_RDI->super_Symbol);
  ScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/ast/symbols/ClassSymbols.cpp:946:29)>
  ::ScopeGuard(&local_320,&local_328);
  uVar10 = in_RDI->recursionDepth + 1;
  in_RDI->recursionDepth = uVar10;
  pCVar4 = Compilation::getOptions(local_308);
  if (pCVar4->maxRecursiveClassSpecialization < uVar10) {
    local_338 = 0x1f0009;
    code.subsystem._1_1_ = in_stack_fffffffffffff795;
    code.subsystem._0_1_ = in_stack_fffffffffffff794;
    code.code._0_1_ = in_stack_fffffffffffff796;
    code.code._1_1_ = in_stack_fffffffffffff797;
    ASTContext::addDiag((ASTContext *)in_stack_fffffffffffff780._M_extent_value,code,
                        in_stack_fffffffffffff788);
    local_358 = (char *)(in_RDI->super_Symbol).name._M_len;
    SStack_350 = (SourceLocation)(in_RDI->super_Symbol).name._M_str;
    arg._M_str = in_stack_fffffffffffff7c0;
    arg._M_len = in_stack_fffffffffffff7b8;
    Diagnostic::operator<<
              ((Diagnostic *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),arg);
    local_2d8 = (ClassType *)Compilation::getErrorType(local_308);
    local_35c = 1;
    goto LAB_003fc5a6;
  }
  local_368 = BumpAllocator::
              emplace<slang::ast::ClassType,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation_const&>
                        ((BumpAllocator *)in_stack_fffffffffffff7a0,in_stack_fffffffffffff798,
                         (basic_string_view<char,_std::char_traits<char>_> *)
                         CONCAT17(in_stack_fffffffffffff797,
                                  CONCAT16(in_stack_fffffffffffff796,
                                           CONCAT15(in_stack_fffffffffffff795,
                                                    CONCAT14(in_stack_fffffffffffff794,
                                                             in_stack_fffffffffffff790)))),
                         (SourceLocation *)in_stack_fffffffffffff788);
  local_368->genericClass = in_RDI;
  local_729 = true;
  if ((bVar1 & 1) == 0) {
    not_null<const_slang::ast::Scope_*>::operator->((not_null<const_slang::ast::Scope_*> *)0x3fb337)
    ;
    local_729 = Scope::isUninstantiated(in_stack_fffffffffffff7a8);
  }
  local_368->isUninstantiated = local_729;
  Symbol::getIndex(&in_RDI->super_Symbol);
  Symbol::setParent((Symbol *)in_stack_fffffffffffff780._M_extent_value,
                    (Scope *)in_stack_fffffffffffff778,
                    (SymbolIndex)((ulong)in_stack_fffffffffffff770 >> 0x20));
  local_369 = in_R8 == (ClassDeclarationSyntax *)0x0;
  not_null<const_slang::ast::Scope_*>::operator*((not_null<const_slang::ast::Scope_*> *)0x3fb3f3);
  std::span<const_slang::ast::DefinitionSymbol::ParameterDecl,_18446744073709551615UL>::
  span<const_slang::SmallVector<slang::ast::DefinitionSymbol::ParameterDecl,_8UL>_&>
            ((span<const_slang::ast::DefinitionSymbol::ParameterDecl,_18446744073709551615UL> *)
             in_stack_fffffffffffff780._M_extent_value,in_stack_fffffffffffff778);
  definitionName._M_str._0_4_ = in_stack_fffffffffffff790;
  definitionName._M_len = (size_t)in_stack_fffffffffffff788;
  definitionName._M_str._4_1_ = in_stack_fffffffffffff794;
  definitionName._M_str._5_1_ = in_stack_fffffffffffff795;
  definitionName._M_str._6_1_ = in_stack_fffffffffffff796;
  definitionName._M_str._7_1_ = in_stack_fffffffffffff797;
  parameterDecls._M_extent._M_extent_value = in_stack_fffffffffffff780._M_extent_value;
  parameterDecls._M_ptr = (pointer)in_stack_fffffffffffff778;
  ParameterBuilder::ParameterBuilder
            ((ParameterBuilder *)in_stack_fffffffffffff770,(Scope *)in_stack_fffffffffffff768,
             definitionName,parameterDecls);
  ParameterBuilder::setForceInvalidValues(&local_508,(bool)(bVar1 & 1));
  ParameterBuilder::setSuppressErrors(&local_508,(bool)(local_369 & 1));
  ParameterBuilder::setInstanceContext(&local_508,(ASTContext *)in_RSI);
  if (in_R8 != (ClassDeclarationSyntax *)0x0) {
    ParameterBuilder::setAssignments
              (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,(bool)isFromConfig);
  }
  local_548 = SourceLocation::operator+<int>
                        ((SourceLocation *)in_stack_fffffffffffff778,
                         (int)((ulong)in_stack_fffffffffffff770 >> 0x20));
  SourceRange::SourceRange((SourceRange *)&stack0xfffffffffffffac8,in_RDX,local_548);
  SmallVector<const_slang::ConstantValue_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ConstantValue_*,_5UL> *)0x3fb54b);
  SmallVector<const_slang::ast::Type_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::Type_*,_5UL> *)0x3fb558);
  local_5d0 = &(in_RDI->paramDecls).
               super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>;
  local_5d8 = SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>::begin(local_5d0);
  local_5e0 = SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>::end(local_5d0);
  src = extraout_RDX;
  for (; local_5d8 != local_5e0; local_5d8 = local_5d8 + 1) {
    local_5e8 = local_5d8;
    local_5f0 = ParameterBuilder::createParam
                          ((ParameterBuilder *)in_stack_fffffffffffffad0,
                           (ParameterDecl *)in_stack_fffffffffffffac8,(Scope *)in_RDX,
                           in_stack_fffffffffffffad8);
    bVar2 = ParameterBuilder::hasErrors(&local_508);
    if (bVar2) {
      if ((local_369 & 1) == 0) {
        local_2d8 = (ClassType *)Compilation::getErrorType(local_308);
      }
      else {
        local_2d8 = (ClassType *)0x0;
      }
      goto LAB_003fc56e;
    }
    bVar2 = ParameterSymbolBase::isLocalParam(local_5f0);
    src = extraout_RDX_00;
    if (!bVar2) {
      local_600 = local_5f0->symbol;
      if (local_600->kind == Parameter) {
        local_608 = Symbol::as<slang::ast::ParameterSymbol>((Symbol *)0x3fb71d);
        local_610 = ParameterSymbol::getValue
                              (in_stack_fffffffffffff918,(SourceRange)in_stack_fffffffffffff920);
        SmallVectorBase<const_slang::ConstantValue_*>::push_back
                  ((SmallVectorBase<const_slang::ConstantValue_*> *)in_stack_fffffffffffff770,
                   (ConstantValue **)in_stack_fffffffffffff768);
        src = extraout_RDX_01;
      }
      else {
        local_630 = Symbol::as<slang::ast::TypeParameterSymbol>((Symbol *)0x3fb7a4);
        local_638 = DeclaredType::getType((DeclaredType *)in_stack_fffffffffffff7e0._M_extent_value)
        ;
        SmallVectorBase<const_slang::ast::Type_*>::push_back
                  ((SmallVectorBase<const_slang::ast::Type_*> *)in_stack_fffffffffffff770,
                   (Type **)in_stack_fffffffffffff768);
        src = extraout_RDX_02;
      }
    }
  }
  if ((bVar1 & 1) == 0) {
    iVar3 = SmallVectorBase<const_slang::ConstantValue_*>::copy
                      (local_588,(EVP_PKEY_CTX *)local_308,src);
    local_680 = CONCAT44(extraout_var,iVar3);
    std::span<const_slang::ConstantValue_*const,_18446744073709551615UL>::
    span<const_slang::ConstantValue_*,_18446744073709551615UL>
              ((span<const_slang::ConstantValue_*const,_18446744073709551615UL> *)
               in_stack_fffffffffffff780._M_extent_value,
               (span<const_slang::ConstantValue_*,_18446744073709551615UL> *)
               in_stack_fffffffffffff778);
    iVar3 = SmallVectorBase<const_slang::ast::Type_*>::copy
                      (local_5c8,(EVP_PKEY_CTX *)local_308,src_00);
    local_6a0 = CONCAT44(extraout_var_00,iVar3);
    std::span<const_slang::ast::Type_*const,_18446744073709551615UL>::
    span<const_slang::ast::Type_*,_18446744073709551615UL>
              ((span<const_slang::ast::Type_*const,_18446744073709551615UL> *)
               in_stack_fffffffffffff780._M_extent_value,
               (span<const_slang::ast::Type_*,_18446744073709551615UL> *)in_stack_fffffffffffff778);
    paramValues_00._M_ptr._6_1_ = in_stack_fffffffffffff7ee;
    paramValues_00._M_ptr._0_6_ = in_stack_fffffffffffff7e8;
    paramValues_00._M_ptr._7_1_ = in_stack_fffffffffffff7ef;
    paramValues_00._M_extent._M_extent_value = in_stack_fffffffffffff7f0._M_extent_value;
    typeParams_00._M_extent._M_extent_value = in_stack_fffffffffffff7e0._M_extent_value;
    typeParams_00._M_ptr = in_stack_fffffffffffff7d8;
    detail::ClassSpecializationKey::ClassSpecializationKey
              (in_stack_fffffffffffff7d0,paramValues_00,typeParams_00);
    if ((local_368->isUninstantiated & 1U) == 0) {
      pSVar12 = &in_RDI->specMap;
      local_260 = &local_660;
      local_268 = (ClassType *)&local_368;
      local_258 = pSVar12;
      paVar5 = boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
               ::al((table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                     *)0x3fbf89);
      boost::unordered::detail::foa::
      alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>,_slang::ast::detail::ClassSpecializationKey_&,_void>
      ::alloc_cted_or_fwded_key_type(&local_270,paVar5,local_260);
      pCVar8 = boost::unordered::detail::foa::
               alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>,_slang::ast::detail::ClassSpecializationKey_&,_void>
               ::move_or_fwd(&local_270);
      pCVar11 = local_268;
      ptVar9 = (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                *)boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::ast::detail::ClassSpecializationHasher,std::equal_to<slang::ast::detail::ClassSpecializationKey>,std::allocator<std::pair<slang::ast::detail::ClassSpecializationKey_const,slang::ast::Type_const*>>>
                  ::key_from<slang::ast::detail::ClassSpecializationKey,slang::ast::ClassType*>
                            (pCVar8,local_268);
      args_2 = (ClassType **)
               boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
               ::hash_for<slang::ast::detail::ClassSpecializationKey>
                         ((table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                           *)in_stack_fffffffffffff770,
                          (ClassSpecializationKey *)in_stack_fffffffffffff768);
      ppCVar14 = args_2;
      local_1c0 = boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                  ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                                  *)in_stack_fffffffffffff770,(size_t)in_stack_fffffffffffff768);
      pSVar13 = pSVar12;
      local_20 = ppCVar14;
      local_18 = local_1c0;
      local_10 = ptVar9;
      local_8 = pSVar12;
      boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                (&local_30,local_1c0);
      do {
        local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
        local_40 = boost::unordered::detail::foa::
                   table_arrays<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                   ::groups((table_arrays<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                             *)0x3fc0dc);
        local_40 = local_40 + local_38;
        uVar10 = boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::match
                           ((group15<boost::unordered::detail::foa::plain_integral> *)
                            in_stack_fffffffffffff778,(size_t)in_stack_fffffffffffff770);
        local_44 = uVar10;
        if (uVar10 != 0) {
          local_50 = boost::unordered::detail::foa::
                     table_arrays<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                     ::elements((table_arrays<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                                 *)0x3fc131);
          local_58 = local_50 + local_38 * 0xf;
          do {
            local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
            in_stack_fffffffffffff798 =
                 (Compilation *)
                 boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                 ::pred((table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                         *)0x3fc181);
            in_stack_fffffffffffff7a0 = local_10;
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::ast::detail::ClassSpecializationHasher,std::equal_to<slang::ast::detail::ClassSpecializationKey>,std::allocator<std::pair<slang::ast::detail::ClassSpecializationKey_const,slang::ast::Type_const*>>>
            ::
            key_from<std::pair<slang::ast::detail::ClassSpecializationKey_const,slang::ast::Type_const*>>
                      ((pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>
                        *)0x3fc1b2);
            in_stack_fffffffffffff797 =
                 std::equal_to<slang::ast::detail::ClassSpecializationKey>::operator()
                           ((equal_to<slang::ast::detail::ClassSpecializationKey> *)
                            in_stack_fffffffffffff770,
                            (ClassSpecializationKey *)in_stack_fffffffffffff768,
                            (ClassSpecializationKey *)0x3fc1cd);
            if ((bool)in_stack_fffffffffffff797) {
              boost::unordered::detail::foa::
              table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>
              ::table_locator(&local_1d8,local_40,local_5c,local_58 + local_5c);
              goto LAB_003fc2c3;
            }
            local_44 = local_44 - 1 & local_44;
          } while (local_44 != 0);
        }
        in_stack_fffffffffffff796 =
             boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                               in_stack_fffffffffffff770,(size_t)in_stack_fffffffffffff768);
        if ((bool)in_stack_fffffffffffff796) {
          memset(&local_1d8,0,0x18);
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>
          ::table_locator(&local_1d8);
          goto LAB_003fc2c3;
        }
        bVar2 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                          (&local_30,
                           (pSVar12->table_).
                           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                           .arrays.groups_size_mask);
      } while (bVar2);
      memset(&local_1d8,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>
      ::table_locator(&local_1d8);
LAB_003fc2c3:
      bVar2 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                        ((table_locator *)&local_1d8);
      if (bVar2) {
        local_1e8 = boost::unordered::detail::foa::
                    table<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                    ::make_iterator((locator *)0x3fc2e5);
        local_1e9 = false;
        std::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
        ::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                  ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                    *)&stack0xfffffffffffff920,&local_1e8,&local_1e9);
      }
      else if ((pSVar13->table_).
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
               .size_ctrl.size <
               (pSVar13->table_).
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
               .size_ctrl.ml) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::ast::detail::ClassSpecializationHasher,std::equal_to<slang::ast::detail::ClassSpecializationKey>,std::allocator<std::pair<slang::ast::detail::ClassSpecializationKey_const,slang::ast::Type_const*>>>
        ::
        unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::detail::ClassSpecializationKey&,slang::ast::ClassType*&>
                  (in_stack_fffffffffffff7a0,(size_t)in_stack_fffffffffffff798,
                   CONCAT17(in_stack_fffffffffffff797,
                            CONCAT16(in_stack_fffffffffffff796,
                                     CONCAT15(in_stack_fffffffffffff795,
                                              CONCAT14(in_stack_fffffffffffff794,
                                                       in_stack_fffffffffffff790)))),
                   (try_emplace_args_t *)in_stack_fffffffffffff788,
                   (ClassSpecializationKey *)in_stack_fffffffffffff780._M_extent_value,
                   (ClassType **)CONCAT44(uVar10,in_stack_fffffffffffff7b0));
        local_200 = boost::unordered::detail::foa::
                    table<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                    ::make_iterator((locator *)0x3fc381);
        local_219[0] = true;
        std::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
        ::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                  ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                    *)&stack0xfffffffffffff920,&local_200,local_219);
        in_stack_fffffffffffff768 = pCVar11;
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::ast::detail::ClassSpecializationHasher,std::equal_to<slang::ast::detail::ClassSpecializationKey>,std::allocator<std::pair<slang::ast::detail::ClassSpecializationKey_const,slang::ast::Type_const*>>>
        ::
        unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::detail::ClassSpecializationKey&,slang::ast::ClassType*&>
                  (in_stack_fffffffffffff800,(size_t)in_stack_fffffffffffff7f8,
                   (try_emplace_args_t *)in_stack_fffffffffffff7f0._M_extent_value,
                   (ClassSpecializationKey *)
                   CONCAT17(in_stack_fffffffffffff7ef,
                            CONCAT16(in_stack_fffffffffffff7ee,in_stack_fffffffffffff7e8)),args_2);
        local_230 = boost::unordered::detail::foa::
                    table<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                    ::make_iterator((locator *)0x3fc3f9);
        local_249[0] = true;
        std::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
        ::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                  ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                    *)&stack0xfffffffffffff920,&local_230,local_249);
      }
      std::
      get<0ul,boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>*,false>,bool>
                ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                  *)0x3fc441);
      ptVar6 = std::
               get<1ul,boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>*,false>,bool>
                         ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                           *)0x3fc456);
      if ((*ptVar6 & 1U) != 0) goto LAB_003fc498;
      ppVar7 = boost::unordered::detail::foa::
               table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
               ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                             *)0x3fc478);
      local_2d8 = (ClassType *)ppVar7->second;
    }
    else {
      pSVar13 = &in_RDI->uninstantiatedSpecMap;
      local_288._M_value = (unsigned_long)&local_660;
      local_290 = (ClassType *)&local_368;
      local_280 = pSVar13;
      paVar5 = boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
               ::al((table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                     *)0x3fb9a4);
      boost::unordered::detail::foa::
      alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>,_slang::ast::detail::ClassSpecializationKey_&,_void>
      ::alloc_cted_or_fwded_key_type(&local_298,paVar5,(ClassSpecializationKey *)local_288);
      local_d8 = boost::unordered::detail::foa::
                 alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>,_slang::ast::detail::ClassSpecializationKey_&,_void>
                 ::move_or_fwd(&local_298);
      local_d0 = &local_299;
      local_e0 = local_290;
      local_c8 = pSVar13;
      local_e8 = boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::ast::detail::ClassSpecializationHasher,std::equal_to<slang::ast::detail::ClassSpecializationKey>,std::allocator<std::pair<slang::ast::detail::ClassSpecializationKey_const,slang::ast::Type_const*>>>
                 ::key_from<slang::ast::detail::ClassSpecializationKey,slang::ast::ClassType*>
                           (local_d8,local_290);
      local_f0 = boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                 ::hash_for<slang::ast::detail::ClassSpecializationKey>
                           ((table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                             *)in_stack_fffffffffffff770,
                            (ClassSpecializationKey *)in_stack_fffffffffffff768);
      local_f8 = boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                 ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                                 *)in_stack_fffffffffffff770,(size_t)in_stack_fffffffffffff768);
      local_70 = local_e8;
      local_80 = local_f0;
      local_78 = local_f8;
      local_68 = pSVar13;
      boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                (&local_90,local_f8);
      do {
        local_98 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_90);
        local_a0 = boost::unordered::detail::foa::
                   table_arrays<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                   ::groups((table_arrays<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                             *)0x3fbb1e);
        local_a0 = local_a0 + local_98;
        local_a4 = boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::match
                             ((group15<boost::unordered::detail::foa::plain_integral> *)
                              in_stack_fffffffffffff778,(size_t)in_stack_fffffffffffff770);
        if (local_a4 != 0) {
          local_b0 = boost::unordered::detail::foa::
                     table_arrays<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                     ::elements((table_arrays<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                                 *)0x3fbb7c);
          local_b8 = local_b0 + local_98 * 0xf;
          do {
            local_bc = boost::unordered::detail::foa::unchecked_countr_zero(0);
            in_stack_fffffffffffff7f0._M_extent_value =
                 (size_t)boost::unordered::detail::foa::
                         table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                         ::pred((table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                                 *)0x3fbbcf);
            in_stack_fffffffffffff7f8 = local_70;
            in_stack_fffffffffffff800 =
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                  *)boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::ast::detail::ClassSpecializationHasher,std::equal_to<slang::ast::detail::ClassSpecializationKey>,std::allocator<std::pair<slang::ast::detail::ClassSpecializationKey_const,slang::ast::Type_const*>>>
                    ::
                    key_from<std::pair<slang::ast::detail::ClassSpecializationKey_const,slang::ast::Type_const*>>
                              ((pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>
                                *)0x3fbc06);
            in_stack_fffffffffffff7ef =
                 std::equal_to<slang::ast::detail::ClassSpecializationKey>::operator()
                           ((equal_to<slang::ast::detail::ClassSpecializationKey> *)
                            in_stack_fffffffffffff770,
                            (ClassSpecializationKey *)in_stack_fffffffffffff768,
                            (ClassSpecializationKey *)0x3fbc2d);
            if ((bool)in_stack_fffffffffffff7ef) {
              boost::unordered::detail::foa::
              table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>
              ::table_locator(&local_110,local_a0,local_bc,local_b8 + local_bc);
              goto LAB_003fbd32;
            }
            local_a4 = local_a4 - 1 & local_a4;
          } while (local_a4 != 0);
        }
        in_stack_fffffffffffff7ee =
             boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                               in_stack_fffffffffffff770,(size_t)in_stack_fffffffffffff768);
        if ((bool)in_stack_fffffffffffff7ee) {
          memset(&local_110,0,0x18);
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>
          ::table_locator(&local_110);
          goto LAB_003fbd32;
        }
        bVar2 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                          (&local_90,
                           (in_RDI->uninstantiatedSpecMap).table_.
                           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                           .arrays.groups_size_mask);
      } while (bVar2);
      memset(&local_110,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>
      ::table_locator(&local_110);
LAB_003fbd32:
      bVar2 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                        ((table_locator *)&local_110);
      if (bVar2) {
        local_120 = boost::unordered::detail::foa::
                    table<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                    ::make_iterator((locator *)0x3fbd54);
        local_121 = false;
        std::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
        ::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                  (&local_6b8,&local_120,&local_121);
      }
      else if ((in_RDI->uninstantiatedSpecMap).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
               .size_ctrl.size <
               (in_RDI->uninstantiatedSpecMap).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
               .size_ctrl.ml) {
        in_stack_fffffffffffff768 = local_e0;
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::ast::detail::ClassSpecializationHasher,std::equal_to<slang::ast::detail::ClassSpecializationKey>,std::allocator<std::pair<slang::ast::detail::ClassSpecializationKey_const,slang::ast::Type_const*>>>
        ::
        unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::detail::ClassSpecializationKey&,slang::ast::ClassType*&>
                  (in_stack_fffffffffffff7a0,(size_t)in_stack_fffffffffffff798,
                   CONCAT17(in_stack_fffffffffffff797,
                            CONCAT16(in_stack_fffffffffffff796,
                                     CONCAT15(in_stack_fffffffffffff795,
                                              CONCAT14(in_stack_fffffffffffff794,
                                                       in_stack_fffffffffffff790)))),
                   (try_emplace_args_t *)in_stack_fffffffffffff788,
                   (ClassSpecializationKey *)in_stack_fffffffffffff780._M_extent_value,
                   (ClassType **)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
        local_138 = boost::unordered::detail::foa::
                    table<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                    ::make_iterator((locator *)0x3fbdf6);
        local_151[0] = true;
        std::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
        ::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                  (&local_6b8,&local_138,local_151);
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::ast::detail::ClassSpecializationHasher,std::equal_to<slang::ast::detail::ClassSpecializationKey>,std::allocator<std::pair<slang::ast::detail::ClassSpecializationKey_const,slang::ast::Type_const*>>>
        ::
        unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::detail::ClassSpecializationKey&,slang::ast::ClassType*&>
                  (in_stack_fffffffffffff800,(size_t)in_stack_fffffffffffff7f8,
                   (try_emplace_args_t *)in_stack_fffffffffffff7f0._M_extent_value,
                   (ClassSpecializationKey *)
                   CONCAT17(in_stack_fffffffffffff7ef,
                            CONCAT16(in_stack_fffffffffffff7ee,in_stack_fffffffffffff7e8)),
                   (ClassType **)in_stack_fffffffffffff7e0._M_extent_value);
        local_168 = boost::unordered::detail::foa::
                    table<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
                    ::make_iterator((locator *)0x3fbe71);
        local_181[0] = true;
        std::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
        ::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                  (&local_6b8,&local_168,local_181);
      }
      std::
      get<0ul,boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>*,false>,bool>
                ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                  *)0x3fbeb9);
      ptVar6 = std::
               get<1ul,boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>*,false>,bool>
                         ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                           *)0x3fbece);
      if ((*ptVar6 & 1U) != 0) goto LAB_003fc498;
      ppVar7 = boost::unordered::detail::foa::
               table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
               ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                             *)0x3fbef0);
      local_2d8 = (ClassType *)ppVar7->second;
    }
  }
  else {
LAB_003fc498:
    bVar2 = function_ref::operator_cast_to_bool((function_ref *)&in_RDI->specializeFunc);
    if (bVar2) {
      function_ref<void_(slang::ast::Compilation_&,_slang::ast::ClassType_&,_slang::SourceLocation)>
      ::operator()((function_ref<void_(slang::ast::Compilation_&,_slang::ast::ClassType_&,_slang::SourceLocation)>
                    *)in_stack_fffffffffffff778,in_stack_fffffffffffff770,in_stack_fffffffffffff768,
                   (SourceLocation)in_stack_fffffffffffff780._M_extent_value);
    }
    else {
      this_00 = Symbol::getSyntax(&in_RDI->super_Symbol);
      in_stack_fffffffffffff770 =
           (Compilation *)
           slang::syntax::SyntaxNode::as<slang::syntax::ClassDeclarationSyntax>(this_00);
      ClassType::populate(in_RSI,(Scope *)CONCAT17(bVar1,in_stack_fffffffffffffd08),in_R8);
    }
    local_2d8 = local_368;
  }
LAB_003fc56e:
  local_35c = 1;
  SmallVector<const_slang::ast::Type_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::Type_*,_5UL> *)0x3fc57b);
  SmallVector<const_slang::ConstantValue_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ConstantValue_*,_5UL> *)0x3fc588);
  ParameterBuilder::~ParameterBuilder((ParameterBuilder *)0x3fc595);
LAB_003fc5a6:
  ScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/ast/symbols/ClassSymbols.cpp:946:29)>
  ::~ScopeGuard((ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_ast_symbols_ClassSymbols_cpp:946:29)>
                 *)in_stack_fffffffffffff770);
  return &local_2d8->super_Type;
}

Assistant:

const Type* GenericClassDefSymbol::getSpecializationImpl(
    const ASTContext& context, SourceLocation instanceLoc, bool forceInvalidParams,
    const ParameterValueAssignmentSyntax* syntax) const {

    auto& comp = context.getCompilation();
    auto scope = getParentScope();
    SLANG_ASSERT(scope);

    auto guard = ScopeGuard([this] { recursionDepth--; });
    if (++recursionDepth > comp.getOptions().maxRecursiveClassSpecialization) {
        context.addDiag(diag::RecursiveClassSpecialization, instanceLoc) << name;
        return &comp.getErrorType();
    }

    // Create a class type instance to hold the parameters. If it turns out we already
    // have this specialization cached we'll throw it away, but that's not a big deal.
    auto classType = comp.emplace<ClassType>(comp, name, location);
    classType->genericClass = this;
    classType->isUninstantiated = forceInvalidParams || context.scope->isUninstantiated();
    classType->setParent(*scope, getIndex());

    // If this is for the default specialization, `syntax` will be null.
    // We want to suppress errors about params not having values and just
    // return null so that the caller can figure out if this is actually a problem.
    const bool isForDefault = syntax == nullptr;

    ParameterBuilder paramBuilder(*context.scope, name, paramDecls);
    paramBuilder.setForceInvalidValues(forceInvalidParams);
    paramBuilder.setSuppressErrors(isForDefault);
    paramBuilder.setInstanceContext(context);
    if (syntax)
        paramBuilder.setAssignments(*syntax, /* isFromConfig */ false);

    SourceRange instRange = {instanceLoc, instanceLoc + 1};

    SmallVector<const ConstantValue*> paramValues;
    SmallVector<const Type*> typeParams;
    for (auto& decl : paramDecls) {
        auto& param = paramBuilder.createParam(decl, *classType, instanceLoc);
        if (paramBuilder.hasErrors()) {
            if (isForDefault)
                return nullptr;

            // Otherwise use an error type instead.
            return &comp.getErrorType();
        }

        if (!param.isLocalParam()) {
            auto& sym = param.symbol;
            if (sym.kind == SymbolKind::Parameter) {
                auto& ps = sym.as<ParameterSymbol>();
                paramValues.push_back(&ps.getValue(instRange));
            }
            else {
                auto& tps = sym.as<TypeParameterSymbol>();
                typeParams.push_back(&tps.targetType.getType());
            }
        }
    }

    if (!forceInvalidParams) {
        detail::ClassSpecializationKey key(paramValues.copy(comp), typeParams.copy(comp));
        if (classType->isUninstantiated) {
            // If we're in an uninstantiated scope we save this specialization
            // in a separate map so that we don't try to elaborate it further
            // and potentially cause spurious errors to be issued.
            auto [it, inserted] = uninstantiatedSpecMap.emplace(key, classType);
            if (!inserted)
                return it->second;
        }
        else {
            auto [it, inserted] = specMap.emplace(key, classType);
            if (!inserted)
                return it->second;
        }
    }

    // Not found, so this is a new entry. Fill in its members and store the
    // specialization for later lookup. If we have a specialization function,
    // call that instead of trying to create from our syntax node.
    if (specializeFunc)
        specializeFunc(comp, *classType, instanceLoc);
    else
        classType->populate(*scope, getSyntax()->as<ClassDeclarationSyntax>());

    return classType;
}